

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

void flatbuffers::kotlin::KotlinKMPGenerator::GenerateGetterOneLine
               (CodeWriter *writer,string *name,string *type,function<void_()> *body)

{
  string *this;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  function<void_()> *local_28;
  function<void_()> *body_local;
  string *type_local;
  string *name_local;
  CodeWriter *writer_local;
  
  local_28 = body;
  body_local = (function<void_()> *)type;
  type_local = name;
  name_local = (string *)writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"_name",&local_49);
  CodeWriter::SetValue(writer,&local_48,type_local);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  this = name_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"_type",&local_81);
  CodeWriter::SetValue((CodeWriter *)this,&local_80,(string *)body_local);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"val {{_name}} : {{_type}} get() = \\",&local_a9);
  CodeWriter::operator+=((CodeWriter *)name_local,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::function<void_()>::operator()(local_28);
  return;
}

Assistant:

static void GenerateGetterOneLine(CodeWriter &writer, const std::string &name,
                                    const std::string &type,
                                    const std::function<void()> &body) {
    // Generates Kotlin getter for properties
    // e.g.:
    // val prop: Mytype get() = x
    writer.SetValue("_name", name);
    writer.SetValue("_type", type);
    writer += "val {{_name}} : {{_type}} get() = \\";
    body();
  }